

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

string * __thiscall
pbrt::ParsedParameter::ToString_abi_cxx11_(string *__return_storage_ptr__,ParsedParameter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  double *pdVar3;
  string *psVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  ulong *puVar8;
  undefined8 uVar9;
  ulong uVar10;
  long lVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  size_t sVar12;
  double d;
  string local_100;
  string *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_b8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_b8;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_e0 = __return_storage_ptr__;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"\"","");
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_50,(ulong)(this->type)._M_dataplus._M_p);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_60 = *plVar7;
    lStack_58 = plVar5[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar7;
    local_70 = (long *)*plVar5;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_90 = &local_80;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_80 = *plVar7;
    lStack_78 = plVar5[3];
  }
  else {
    local_80 = *plVar7;
    local_90 = (long *)*plVar5;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)(this->name)._M_dataplus._M_p);
  paVar1 = &local_d8.field_2;
  puVar8 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_d8.field_2._M_allocated_capacity = *puVar8;
    local_d8.field_2._8_8_ = plVar5[3];
    local_d8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_d8.field_2._M_allocated_capacity = *puVar8;
    local_d8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_d8._M_string_length = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"\" [ ","");
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    uVar9 = local_d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_a8 + local_d8._M_string_length) {
    uVar10 = 0xf;
    if (local_b0 != local_a0) {
      uVar10 = local_a0[0];
    }
    if (local_a8 + local_d8._M_string_length <= uVar10) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_b0,0,(char *)0x0,(ulong)local_d8._M_dataplus._M_p);
      goto LAB_0023973f;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_b0);
LAB_0023973f:
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  puVar8 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_100.field_2._M_allocated_capacity = *puVar8;
    local_100.field_2._8_8_ = puVar6[3];
  }
  else {
    local_100.field_2._M_allocated_capacity = *puVar8;
    local_100._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_100._M_string_length = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)puVar8 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_100._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  sVar2 = (this->numbers).nStored;
  if (sVar2 == 0) {
    sVar2 = (this->strings).nStored;
    if (sVar2 == 0) {
      sVar2 = (this->bools).nStored;
      if (sVar2 != 0) {
        sVar12 = 0;
        do {
          std::__cxx11::string::append((char *)local_e0);
          sVar12 = sVar12 + 1;
        } while (sVar2 != sVar12);
      }
    }
    else {
      __rhs = (this->strings).ptr;
      lVar11 = sVar2 << 5;
      do {
        std::operator+(&local_d8,'\"',__rhs);
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
        puVar8 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar8) {
          local_100.field_2._M_allocated_capacity = *puVar8;
          local_100.field_2._8_8_ = puVar6[3];
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        }
        else {
          local_100.field_2._M_allocated_capacity = *puVar8;
          local_100._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_100._M_string_length = puVar6[1];
        *puVar6 = puVar8;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_e0,(ulong)local_100._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar1) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        __rhs = __rhs + 1;
        lVar11 = lVar11 + -0x20;
      } while (lVar11 != 0);
    }
  }
  else {
    pdVar3 = (this->numbers).ptr;
    lVar11 = 0;
    do {
      local_d8._M_dataplus._M_p = *(pointer *)((long)pdVar3 + lVar11);
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      local_100._M_string_length = 0;
      local_100.field_2._M_allocated_capacity =
           local_100.field_2._M_allocated_capacity & 0xffffffffffffff00;
      detail::stringPrintfRecursive<double&>(&local_100,"%f ",(double *)&local_d8);
      std::__cxx11::string::_M_append((char *)local_e0,(ulong)local_100._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      lVar11 = lVar11 + 8;
    } while (sVar2 << 3 != lVar11);
  }
  psVar4 = local_e0;
  std::__cxx11::string::append((char *)local_e0);
  return psVar4;
}

Assistant:

std::string ParsedParameter::ToString() const {
    std::string str;
    str += std::string("\"") + type + " " + name + std::string("\" [ ");
    if (!numbers.empty())
        for (double d : numbers)
            str += StringPrintf("%f ", d);
    else if (!strings.empty())
        for (const auto &s : strings)
            str += '\"' + s + "\" ";
    else if (!bools.empty())
        for (bool b : bools)
            str += b ? "true " : "false ";
    str += "] ";

    return str;
}